

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorBG.cpp
# Opt level: O2

AlphaVector * __thiscall
AlphaVectorBG::BeliefBackup
          (AlphaVector *__return_storage_ptr__,AlphaVectorBG *this,JointBeliefInterface *b,Index a,
          GaoVectorSet *G,ValueFunctionPOMDPDiscrete *V,BGBackupType type)

{
  _func_int *p_Var1;
  uint uVar2;
  allocator<char> local_61;
  AlphaVector *local_60;
  AlphaVector local_58;
  
  p_Var1 = this->_vptr_AlphaVectorBG[-3];
  local_60 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"BeliefBackupBG",&local_61)
  ;
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)((long)&this->_vptr_AlphaVectorBG + (long)p_Var1),(string *)&local_58
            );
  std::__cxx11::string::~string((string *)&local_58);
  uVar2 = (**(code **)(*(long *)(&b->field_0x0 + *(long *)((long)*b + -0xb8)) + 0x70))
                    (&b->field_0x0 + *(long *)((long)*b + -0xb8));
  AlphaVector::AlphaVector(local_60,(ulong)uVar2);
  if (type - BGIP_SOLVER_EXHAUSTIVE < 4) {
    BeliefBackupBGIP_Solver(&local_58,this,b,a,G,V,type);
    AlphaVector::operator=(local_60,&local_58);
  }
  else if (type == EXHAUSTIVE_ONLYKEEPMAX) {
    BeliefBackupExhaustiveOnlyKeepMax(&local_58,this,b,a,G,V);
    AlphaVector::operator=(local_60,&local_58);
  }
  else {
    if (type != EXHAUSTIVE_STOREALL) goto LAB_0042105d;
    BeliefBackupExhaustiveStoreAll(&local_58,this,b,a,G,V);
    AlphaVector::operator=(local_60,&local_58);
  }
  AlphaVector::~AlphaVector(&local_58);
LAB_0042105d:
  p_Var1 = this->_vptr_AlphaVectorBG[-3];
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"BeliefBackupBG",&local_61)
  ;
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)((long)&this->_vptr_AlphaVectorBG + (long)p_Var1),(string *)&local_58
            );
  std::__cxx11::string::~string((string *)&local_58);
  return local_60;
}

Assistant:

AlphaVector
AlphaVectorBG::BeliefBackup(const JointBeliefInterface &b,
                            Index a,
                            const GaoVectorSet &G,
                            const ValueFunctionPOMDPDiscrete &V,
                            BGBackupType type) const
{
#if DEBUG_AlphaVectorBG_BeliefBackup
    tms timeStruct;
    clock_t ticks_before, ticks_after;
    ticks_before = times(&timeStruct);
#endif

    StartTimer("BeliefBackupBG");

    AlphaVector alpha(b.Size());
    switch(type)
    {
    case EXHAUSTIVE_ONLYKEEPMAX:
        alpha=BeliefBackupExhaustiveOnlyKeepMax(b,a,G,V);
        break;
    case EXHAUSTIVE_STOREALL:
        alpha=BeliefBackupExhaustiveStoreAll(b,a,G,V);
        break;
    case BGIP_SOLVER_EXHAUSTIVE:
    case BGIP_SOLVER_ALTERNATINGMAXIMIZATION:
    case BGIP_SOLVER_ALTERNATINGMAXIMIZATION_100STARTS:
    case BGIP_SOLVER_BRANCH_AND_BOUND:
        alpha=BeliefBackupBGIP_Solver(b,a,G,V,type);
        break;
    }

    StopTimer("BeliefBackupBG");

#if DEBUG_AlphaVectorBG_BeliefBackup
    ticks_after = times(&timeStruct);
    cout << "AlphaVectorBG::BeliefBackup backuptype " << type
         << " done in " 
         << ticks_after - ticks_before << " clock ticks, "
         << static_cast<double>((ticks_after - ticks_before))
        / sysconf(_SC_CLK_TCK) 
         << "s" << endl;
#endif

#if DEBUG_AlphaVectorBG_CheckBGIP_SolverExhaustive
    if(type==BGIP_SOLVER_EXHAUSTIVE)
    {
        AlphaVector alphaOK=BeliefBackup(b,a,G,V,EXHAUSTIVE_ONLYKEEPMAX);
        if(!alphaOK.Equal(alpha))
            abort();
    }
#endif

    return(alpha);
}